

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestOutput.cpp
# Opt level: O0

void __thiscall
TestOutput::printVisualStudioErrorInFileOnLine(TestOutput *this,SimpleString *file,int lineNumber)

{
  char *pcVar1;
  int in_EDX;
  SimpleString *in_RSI;
  long *in_RDI;
  
  (**(code **)(*in_RDI + 0x58))(in_RDI,"\n");
  pcVar1 = SimpleString::asCharString(in_RSI);
  (**(code **)(*in_RDI + 0x58))(in_RDI,pcVar1);
  (**(code **)(*in_RDI + 0x58))(in_RDI,"(");
  (**(code **)(*in_RDI + 0x60))(in_RDI,(long)in_EDX);
  (**(code **)(*in_RDI + 0x58))(in_RDI,"):");
  (**(code **)(*in_RDI + 0x58))(in_RDI," error:");
  return;
}

Assistant:

void TestOutput::printVisualStudioErrorInFileOnLine(SimpleString file, int lineNumber)
{
    print("\n");
    print(file.asCharString());
    print("(");
    print(lineNumber);
    print("):");
    print(" error:");
}